

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  ostream *poVar1;
  Message MVar2;
  bool bVar3;
  char *str;
  size_t sVar4;
  long in_FS_OFFSET;
  Int32 result;
  Message local_40;
  Int32 local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  str = getenv(var);
  if (str != (char *)0x0) {
    Message::Message(&local_40);
    MVar2.ss_.ptr_ = local_40.ss_.ptr_;
    poVar1 = (ostream *)((long)local_40.ss_.ptr_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"The value of environment variable ",0x22);
    if (var == (char *)0x0) {
      sVar4 = 6;
      var = "(null)";
    }
    else {
      sVar4 = strlen(var);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,var,sVar4);
    bVar3 = ParseInt32(&local_40,str,&local_34);
    if (MVar2.ss_.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)MVar2.ss_.ptr_ + 8))(MVar2.ss_.ptr_);
      local_40.ss_.ptr_ =
           (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    default_val = local_34;
    if (!bVar3) {
      exit(1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return default_val;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}